

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
          (SimulationDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *pu,int nrRuns,int seed,
          bool verbose)

{
  (this->super_Simulation)._m_nrRuns = nrRuns;
  (this->super_Simulation)._m_random_seed = seed;
  (this->super_Simulation)._vptr_Simulation =
       (_func_int **)&PTR__SimulationDecPOMDPDiscrete_005a8348;
  this->_m_pu = pu;
  this->_m_saveIntermediateResults = false;
  (this->_m_intermediateResultsFilename)._M_dataplus._M_p =
       (pointer)&(this->_m_intermediateResultsFilename).field_2;
  (this->_m_intermediateResultsFilename)._M_string_length = 0;
  (this->_m_intermediateResultsFilename).field_2._M_local_buf[0] = '\0';
  (this->super_Simulation)._m_verbose = verbose;
  Initialize(this);
  return;
}

Assistant:

SimulationDecPOMDPDiscrete::
SimulationDecPOMDPDiscrete(const PlanningUnitDecPOMDPDiscrete &pu, 
                           int nrRuns, int seed, bool verbose) : 
    Simulation(nrRuns, seed),
    _m_pu(&pu),
    _m_saveIntermediateResults(false)
{
    SetVerbose(verbose);
    Initialize();
}